

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# section.cpp
# Opt level: O3

void sect_BinaryFileSlice(char *s,int32_t start_pos,int32_t length)

{
  bool bVar1;
  int iVar2;
  FILE *__stream;
  ulong uVar3;
  int *piVar4;
  char *pcVar5;
  char *fullPath;
  size_t size;
  char *local_38;
  size_t local_30;
  
  if (start_pos < 0) {
    error("Start position cannot be negative (%d)\n",(ulong)(uint)start_pos);
    start_pos = 0;
  }
  if (length < 0) {
    error("Number of bytes to read cannot be negative (%d)\n",(ulong)(uint)length);
    checkcodesection();
    return;
  }
  bVar1 = checkcodesection();
  if (length == 0 || !bVar1) {
    return;
  }
  bVar1 = reserveSpace(length);
  if (!bVar1) {
    return;
  }
  local_38 = (char *)0x0;
  local_30 = 0;
  bVar1 = fstk_FindFile(s,&local_38,&local_30);
  if (!bVar1) {
    free(local_38);
LAB_001137d9:
    if (generatedMissingIncludes == true) {
      if (verbose == true) {
        piVar4 = __errno_location();
        pcVar5 = strerror(*piVar4);
        printf("Aborting (-MG) on INCBIN file \'%s\' (%s)\n",s,pcVar5);
      }
      failedOnMissingInclude = true;
    }
    else {
      piVar4 = __errno_location();
      pcVar5 = strerror(*piVar4);
      error("Error opening INCBIN file \'%s\': %s\n",s,pcVar5);
    }
    return;
  }
  __stream = fopen(local_38,"rb");
  free(local_38);
  if (__stream == (FILE *)0x0) goto LAB_001137d9;
  iVar2 = fseek(__stream,0,2);
  if (iVar2 == -1) {
    piVar4 = __errno_location();
    if (*piVar4 != 0x1d) {
      pcVar5 = strerror(*piVar4);
      error("Error determining size of INCBIN file \'%s\': %s\n",s,pcVar5);
    }
    for (; start_pos != 0; start_pos = start_pos - 1) {
      fgetc(__stream);
    }
  }
  else {
    uVar3 = ftell(__stream);
    if ((int)(uint)uVar3 < start_pos) {
      error("Specified start position is greater than length of file\n");
      goto LAB_0011392b;
    }
    if ((uint)uVar3 < (uint)(start_pos + length)) {
      error("Specified range in INCBIN is out of bounds (%u + %u > %u)\n",(ulong)(uint)start_pos,
            (ulong)(uint)length,uVar3 & 0xffffffff);
      goto LAB_0011392b;
    }
    fseek(__stream,(ulong)(uint)start_pos,0);
  }
  do {
    iVar2 = fgetc(__stream);
    if (iVar2 == -1) {
      iVar2 = ferror(__stream);
      if (iVar2 == 0) {
        error("Premature end of file (%d bytes left to read)\n",(ulong)(uint)length);
      }
      else {
        piVar4 = __errno_location();
        pcVar5 = strerror(*piVar4);
        error("Error reading INCBIN file \'%s\': %s\n",s,pcVar5);
      }
    }
    else {
      currentSection->data[loadOffset + curOffset] = (uint8_t)iVar2;
      growSection(1);
    }
    length = length - 1;
  } while (length != 0);
LAB_0011392b:
  fclose(__stream);
  return;
}

Assistant:

void sect_BinaryFileSlice(char const *s, int32_t start_pos, int32_t length)
{
	if (start_pos < 0) {
		error("Start position cannot be negative (%" PRId32 ")\n", start_pos);
		start_pos = 0;
	}

	if (length < 0) {
		error("Number of bytes to read cannot be negative (%" PRId32 ")\n", length);
		length = 0;
	}

	if (!checkcodesection())
		return;
	if (length == 0) // Don't even bother with 0-byte slices
		return;
	if (!reserveSpace(length))
		return;

	char *fullPath = NULL;
	size_t size = 0;
	FILE *f = NULL;

	if (fstk_FindFile(s, &fullPath, &size))
		f = fopen(fullPath, "rb");
	free(fullPath);

	if (!f) {
		if (generatedMissingIncludes) {
			if (verbose)
				printf("Aborting (-MG) on INCBIN file '%s' (%s)\n", s, strerror(errno));
			failedOnMissingInclude = true;
		} else {
			error("Error opening INCBIN file '%s': %s\n", s, strerror(errno));
		}
		return;
	}

	int32_t fsize;

	if (fseek(f, 0, SEEK_END) != -1) {
		fsize = ftell(f);

		if (start_pos > fsize) {
			error("Specified start position is greater than length of file\n");
			goto cleanup;
		}

		if ((start_pos + length) > fsize) {
			error("Specified range in INCBIN is out of bounds (%" PRIu32 " + %" PRIu32
			      " > %" PRIu32 ")\n", start_pos, length, fsize);
			goto cleanup;
		}

		fseek(f, start_pos, SEEK_SET);
	} else {
		if (errno != ESPIPE)
			error("Error determining size of INCBIN file '%s': %s\n",
				s, strerror(errno));
		// The file isn't seekable, so we'll just skip bytes
		while (start_pos--)
			(void)fgetc(f);
	}

	while (length--) {
		int byte = fgetc(f);

		if (byte != EOF) {
			writebyte(byte);
		} else if (ferror(f)) {
			error("Error reading INCBIN file '%s': %s\n", s, strerror(errno));
		} else {
			error("Premature end of file (%" PRId32 " bytes left to read)\n",
				length + 1);
		}
	}

cleanup:
	fclose(f);
}